

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::ssl_stream<libtorrent::socks5_stream>::
connected<libtorrent::aux::peer_connection::start()::__0>
          (ssl_stream<libtorrent::socks5_stream> *this,error_code *e,anon_class_16_1_898a5c2a *h)

{
  bool bVar1;
  pointer this_00;
  pointer u;
  __0 local_50 [16];
  aux *local_40;
  wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_aux__ssl_stream_hpp:313:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_peer_connection_cpp:424:6)>
  local_38;
  anon_class_16_1_898a5c2a *local_20;
  anon_class_16_1_898a5c2a *h_local;
  error_code *e_local;
  ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
  *this_local;
  
  local_20 = h;
  h_local = (anon_class_16_1_898a5c2a *)e;
  e_local = (error_code *)this;
  bVar1 = boost::system::error_code::operator_cast_to_bool(e);
  if (bVar1) {
    peer_connection::start::anon_class_16_1_898a5c2a::operator()(h,(error_code *)h_local);
  }
  else {
    this_00 = ::std::
              unique_ptr<boost::asio::ssl::stream<libtorrent::socks5_stream>,_std::default_delete<boost::asio::ssl::stream<libtorrent::socks5_stream>_>_>
              ::operator->(&this->m_sock);
    u = this_00;
    local_40 = (aux *)this;
    peer_connection::start()::$_0::__0(local_50,h);
    wrap_allocator<libtorrent::aux::ssl_stream<libtorrent::socks5_stream>::connected<libtorrent::aux::peer_connection::start()::__0>(boost::system::error_code_const&,libtorrent::aux::peer_connection::start()::__0)::_lambda(boost::system::error_code_const&,libtorrent::aux::peer_connection::start()::__0)_1_,libtorrent::aux::peer_connection::start()::__0>
              (&local_38,local_40,
               (ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
                *)local_50,(anon_class_16_1_898a5c2a *)u);
    boost::asio::ssl::stream<libtorrent::socks5_stream>::
    async_handshake<libtorrent::aux::wrap_allocator_t<libtorrent::aux::ssl_stream<libtorrent::socks5_stream>::connected<libtorrent::aux::peer_connection::start()::__0>(boost::system::error_code_const&,libtorrent::aux::peer_connection::start()::__0)::_lambda(boost::system::error_code_const&,libtorrent::aux::peer_connection::start()::__0)_1_,libtorrent::aux::peer_connection::start()::__0>>
              (this_00,client,&local_38);
    wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/aux_/ssl_stream.hpp:313:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/peer_connection.cpp:424:6)>
    ::~wrap_allocator_t(&local_38);
    peer_connection::start()::$_0::~__0(local_50);
  }
  return;
}

Assistant:

void connected(error_code const& e, Handler h)
	{
		if (e)
		{
			h(e);
			return;
		}

		m_sock->async_handshake(ssl::stream_base::client, wrap_allocator(
			[this](error_code const& ec, Handler hn) {
				handshake(ec, std::move(hn));
			}, std::move(h)));
	}